

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::setLogFile(CommonCore *this,string_view lfile)

{
  GlobalBrokerId id;
  BrokerBase *in_RDI;
  ActionMessage cmd;
  ActionMessage *in_stack_ffffffffffffff08;
  GlobalFederateId in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  SmallBuffer *in_stack_ffffffffffffff38;
  
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c.gid);
  id = CLI::std::atomic<helics::GlobalBrokerId>::load
                 ((atomic<helics::GlobalBrokerId> *)&in_RDI->higher_broker_id,seq_cst);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff2c,id);
  SmallBuffer::operator=
            (in_stack_ffffffffffffff38,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(0x252,in_stack_ffffffffffffff30));
  BrokerBase::addActionMessage(in_RDI,in_stack_ffffffffffffff08);
  ActionMessage::~ActionMessage((ActionMessage *)in_RDI);
  return;
}

Assistant:

void CommonCore::setLogFile(std::string_view lfile)
{
    ActionMessage cmd(CMD_CORE_CONFIGURE);
    cmd.dest_id = global_id.load();
    cmd.messageID = UPDATE_LOGGING_FILE;
    cmd.payload = lfile;
    addActionMessage(cmd);
}